

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O0

bool __thiscall
Clasp::SolveAlgorithm::attach(SolveAlgorithm *this,SharedContext *ctx,ModelHandler *onModel)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  Enumerator *pEVar5;
  SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
  *in_RDX;
  SharedContext *in_RSI;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RDI;
  double dVar6;
  Subsystem in_stack_0000000c;
  SharedContext *in_stack_00000010;
  bool in_stack_0000012f;
  SharedContext *in_stack_00000130;
  Enumerator *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  byte bVar7;
  
  lVar1._0_4_ = in_RDI[1].ebo_.size;
  lVar1._4_4_ = in_RDI[1].ebo_.cap;
  if (lVar1 != 0) {
    Potassco::fail(-2,"bool Clasp::SolveAlgorithm::attach(SharedContext &, ModelHandler *)",0x11c,
                   "!ctx_","SolveAlgorithm is already running!",0);
  }
  bVar3 = SharedContext::frozen(in_RSI);
  if (!bVar3) {
    SharedContext::endInit(in_stack_00000130,in_stack_0000012f);
  }
  SharedContext::report(in_stack_00000010,in_stack_0000000c);
  SharedContext::master((SharedContext *)0x1e2a60);
  bVar3 = Solver::hasConflict((Solver *)0x1e2a68);
  if (((!bVar3) && (lVar2._0_4_ = (in_RDI->ebo_).size, lVar2._4_4_ = (in_RDI->ebo_).cap, lVar2 != 0)
      ) && (uVar4 = (**(code **)((in_RDI->ebo_).buf + 4))(), (uVar4 & 1) == 0)) {
    *(SharedContext **)&in_RDI[1].ebo_.size = in_RSI;
    dVar6 = ThreadTime::getTime();
    *(double *)&in_RDI[5].ebo_.size = dVar6;
    *(SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
      **)&in_RDI[2].ebo_.size = in_RDX;
    *(undefined4 *)&in_RDI[6].ebo_.buf = 0;
    SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
    ::reset(in_RDX,in_RDI);
    pEVar5 = SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)0x1e2b0f);
    if (pEVar5 == (Enumerator *)0x0) {
      EnumOptions::nullEnumerator();
      SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::operator=
                ((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)
                 CONCAT17(in_stack_ffffffffffffffd7,
                          CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)),
                 in_stack_ffffffffffffffc8);
    }
    return true;
  }
  bVar3 = SharedContext::ok((SharedContext *)
                            CONCAT17(in_stack_ffffffffffffffd7,
                                     CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)))
  ;
  bVar7 = 2;
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    bVar7 = 0;
  }
  *(uint *)&in_RDI[6].ebo_.buf = (uint)bVar7;
  return false;
}

Assistant:

bool SolveAlgorithm::attach(SharedContext& ctx, ModelHandler* onModel) {
	POTASSCO_REQUIRE(!ctx_, "SolveAlgorithm is already running!");
	if (!ctx.frozen()) { ctx.endInit(); }
	ctx.report(Event::subsystem_solve);
	if (ctx.master()->hasConflict() || !limits_.conflicts || interrupted()) {
		last_  = !ctx.ok() ? value_false : value_free;
		return false;
	}
	ctx_     = &ctx;
	time_    = ThreadTime::getTime();
	onModel_ = onModel;
	last_    = value_free;
	core_.reset(0);
	if (!enum_.get()) { enum_ = EnumOptions::nullEnumerator(); }
	return true;
}